

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O0

void linenoiseEditHistoryNext(linenoiseState *l,int dir)

{
  char *pcVar1;
  size_t sVar2;
  int iVar3;
  int in_ESI;
  long in_RDI;
  
  if (1 < history_len) {
    free(history[(history_len + -1) - *(int *)(in_RDI + 0x60)]);
    pcVar1 = strdup(*(char **)(in_RDI + 0x18));
    history[(history_len + -1) - *(int *)(in_RDI + 0x60)] = pcVar1;
    iVar3 = -1;
    if (in_ESI == 1) {
      iVar3 = 1;
    }
    *(int *)(in_RDI + 0x60) = iVar3 + *(int *)(in_RDI + 0x60);
    if (*(int *)(in_RDI + 0x60) < 0) {
      *(undefined4 *)(in_RDI + 0x60) = 0;
    }
    else if (*(int *)(in_RDI + 0x60) < history_len) {
      strncpy(*(char **)(in_RDI + 0x18),history[(history_len + -1) - *(int *)(in_RDI + 0x60)],
              *(size_t *)(in_RDI + 0x20));
      *(undefined1 *)(*(long *)(in_RDI + 0x18) + *(long *)(in_RDI + 0x20) + -1) = 0;
      sVar2 = strlen(*(char **)(in_RDI + 0x18));
      *(size_t *)(in_RDI + 0x38) = sVar2;
      *(size_t *)(in_RDI + 0x48) = sVar2;
      refreshLine((linenoiseState *)0x19bd6b);
    }
    else {
      *(int *)(in_RDI + 0x60) = history_len + -1;
    }
  }
  return;
}

Assistant:

static void linenoiseEditHistoryNext(struct linenoiseState * l, int dir) {
    if (history_len > 1) {
        /* Update the current history entry before to
         * overwrite it with the next one. */
        free(history[history_len - 1 - l->history_index]);
        history[history_len - 1 - l->history_index] = strdup(l->buf);
        /* Show the new entry */
        l->history_index += (dir == LINENOISE_HISTORY_PREV) ? 1 : -1;
        if (l->history_index < 0) {
            l->history_index = 0;
            return;
        } else if (l->history_index >= history_len) {
            l->history_index = history_len-1;
            return;
        }
        strncpy(l->buf,history[history_len - 1 - l->history_index],l->buflen);
        l->buf[l->buflen-1] = '\0';
        l->len = l->pos = strlen(l->buf);
        refreshLine(l);
    }
}